

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O2

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::Controller(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
             *this,double *tempo,undefined8 *peerCallback,
            function<void_(ableton::link::Tempo)> *tempoCallback,
            Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *param_5)

{
  GhostXForm *this_00;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *this_01;
  double dVar1;
  long lVar2;
  longlong lVar3;
  microseconds mVar4;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *t;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  GhostXForm GVar9;
  _Any_data local_128;
  long local_118;
  undefined8 local_110;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_100;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_e0;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *local_c0;
  ControllerPeers *local_b8;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_b0;
  pair<ableton::link::NodeState,_ableton::link::GhostXForm> local_a8;
  NodeIdArray local_68;
  double local_60;
  long lStack_58;
  rep local_50;
  double local_48;
  rep rStack_40;
  rep local_38;
  
  std::function<void_(ableton::link::Tempo)>::function(&this->mTempoCallback,tempoCallback);
  lVar2 = NodeId::random();
  *(long *)(this->mNodeId).super_NodeIdArray._M_elems = lVar2;
  *(long *)(this->mSessionId).super_NodeIdArray._M_elems = lVar2;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mSessionTimingGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mSessionTimingGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mSessionTimingGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  GVar9 = detail::initXForm<ableton::platforms::linux::Clock<1>>((Clock<1> *)&this->field_0x20);
  this_00 = &this->mGhostXForm;
  (this->mGhostXForm).slope = GVar9.slope;
  (this->mGhostXForm).intercept.__r = GVar9.intercept.__r.__r;
  uVar5 = 0;
  uVar7 = 0x40340000;
  dVar1 = *tempo;
  if (20.0 <= dVar1) {
    uVar5 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  lVar3 = llround(0.0);
  uVar6 = 0;
  uVar8 = 0x408f3800;
  if ((double)CONCAT44(uVar7,uVar5) <= 999.0) {
    uVar6 = uVar5;
    uVar8 = uVar7;
  }
  (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar8,uVar6);
  (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar3;
  (this->mSessionTimeline).timeOrigin.__r = 0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mClientTimelineGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mClientTimelineGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mClientTimelineGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar8,uVar6);
  lVar3 = llround(0.0);
  (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar3;
  mVar4 = GhostXForm::ghostToHost(this_00,(microseconds)0x0);
  (this->mClientTimeline).timeOrigin.__r = mVar4.__r;
  lVar2 = (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  (this->mRtClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->mRtClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar2;
  (this->mRtClientTimeline).timeOrigin.__r = (this->mClientTimeline).timeOrigin.__r;
  (this->mRtClientTimelineTimestamp).__r = 0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_118 = 0;
  local_110 = peerCallback[3];
  lVar2 = peerCallback[2];
  if (lVar2 != 0) {
    local_128._M_unused._0_8_ = (undefined8)*peerCallback;
    local_128._8_8_ = peerCallback[1];
    peerCallback[2] = 0;
    peerCallback[3] = 0;
    local_118 = lVar2;
  }
  SessionPeerCounter::SessionPeerCounter
            (&this->mSessionPeerCounter,this,(function<void_(unsigned_long)> *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  (this->mEnabled)._M_base._M_i = false;
  this_01 = &this->mIo;
  ableton::platforms::asio::
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::Context
            (&this_01->val,param_5);
  RtTimelineSetter::RtTimelineSetter(&this->mRtTimelineSetter,this);
  local_b0.ref._M_data =
       (reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
        )(reference_wrapper<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
          )this_01;
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  ::Peers(&this->mPeers,&local_b0,
          (reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>
           )&this->mSessionPeerCounter,(SessionTimelineCallback)this);
  local_68._M_elems = *&(this->mSessionId).super_NodeIdArray._M_elems;
  local_60 = (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
             super__Head_base<0UL,_double,_false>._M_head_impl;
  lStack_58 = (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
              super__Head_base<0UL,_long,_false>._M_head_impl;
  local_50 = (this->mSessionTimeline).timeOrigin.__r;
  local_48 = this_00->slope;
  rStack_40 = (this->mGhostXForm).intercept.__r;
  local_38 = (rep)ableton::platforms::linux::Clock<1>::micros((Clock<1> *)&this->field_0x20);
  local_c0 = this_01;
  local_b8 = &this->mPeers;
  Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
  ::Sessions(&this->mSessions,&local_68,&local_b8,this,this);
  local_a8.first.timeline.timeOrigin.__r = (this->mSessionTimeline).timeOrigin.__r;
  local_a8.first.nodeId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mNodeId).super_NodeIdArray._M_elems;
  local_a8.first.sessionId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mSessionId).super_NodeIdArray._M_elems;
  local_a8.first.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_a8.first.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_a8.second.slope = this_00->slope;
  local_a8.second.intercept.__r = (this->mGhostXForm).intercept.__r;
  ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>
  ::
  Context<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::UdpSendExceptionHandler>
            ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)&local_100,
             (UdpSendExceptionHandler)this);
  ableton::util::
  injectVal<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
            ((Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *)&local_e0,(util *)&local_100,t);
  discovery::
  Service<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::Service(&this->mDiscovery,&local_a8,(GatewayFactory)this,
            (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
             *)&local_e0);
  ableton::platforms::asio::
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::~Context(&local_e0);
  ableton::platforms::asio::
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::~Context(&local_100);
  return;
}

Assistant:

Controller(Tempo tempo,
    PeerCountCallback peerCallback,
    TempoCallback tempoCallback,
    Clock clock,
    util::Injected<IoContext> io)
    : mTempoCallback(std::move(tempoCallback))
    , mClock(std::move(clock))
    , mNodeId(NodeId::random())
    , mSessionId(mNodeId)
    , mGhostXForm(detail::initXForm(mClock))
    , mSessionTimeline(clampTempo({tempo, Beats{0.}, std::chrono::microseconds{0}}))
    , mClientTimeline({mSessionTimeline.tempo, Beats{0.},
        mGhostXForm.ghostToHost(std::chrono::microseconds{0})})
    , mRtClientTimeline(mClientTimeline)
    , mRtClientTimelineTimestamp(0)
    , mSessionPeerCounter(*this, std::move(peerCallback))
    , mEnabled(false)
    , mIo(std::move(io))
    , mRtTimelineSetter(*this)
    , mPeers(util::injectRef(*mIo),
        std::ref(mSessionPeerCounter),
        SessionTimelineCallback{*this})
    , mSessions({mSessionId, mSessionTimeline, {mGhostXForm, mClock.micros()}},
        util::injectRef(mPeers),
        MeasurePeer{*this},
        JoinSessionCallback{*this},
        util::injectRef(*mIo),
        mClock)
    , mDiscovery(
        std::make_pair(NodeState{mNodeId, mSessionId, mSessionTimeline}, mGhostXForm),
        GatewayFactory{*this},
        util::injectVal(mIo->clone(UdpSendExceptionHandler{*this})))
  {
  }